

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v9::detail::
         do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>,char,fmt::v9::detail::digit_grouping<char>>
                   (appender out,decimal_fp<float> *f,basic_format_specs<char> *specs,
                   float_specs fspecs,locale_ref loc)

{
  float_specs fVar1;
  byte bVar2;
  int iVar3;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> bVar4;
  appender aVar5;
  byte *pbVar6;
  ulong uVar7;
  long lVar8;
  byte *pbVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  size_t sVar13;
  bool bVar14;
  char decimal_point;
  sign_t sign;
  char zero;
  bool pointy;
  int significand_size;
  significand_type significand;
  int exp;
  int num_zeros;
  anon_class_28_8_ad0ecca5 write;
  undefined1 local_bf [3];
  uint local_bc;
  undefined1 local_b8 [12];
  int local_ac;
  undefined1 local_a8 [8];
  undefined1 local_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  char local_80;
  undefined1 local_78 [8];
  undefined8 local_70;
  undefined8 local_68;
  decimal_fp<float> *local_60;
  digit_grouping<char> *local_58;
  digit_grouping<char> *local_50;
  uint *local_48;
  uint *local_40;
  char *local_38;
  
  local_a8._0_4_ = f->significand;
  uVar10 = 0x1f;
  if ((local_a8._0_4_ | 1) != 0) {
    for (; (local_a8._0_4_ | 1) >> uVar10 == 0; uVar10 = uVar10 - 1) {
    }
  }
  uVar7 = (ulong)(uint)local_a8._0_4_ +
          *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar10 * 8);
  local_ac = (int)(uVar7 >> 0x20);
  local_bf[2] = 0x30;
  local_b8._4_4_ = fspecs._4_4_;
  local_bf[1] = fspecs._5_1_;
  fVar1 = fspecs;
  if ((long)uVar7 < 0) goto LAB_002319f0;
  bVar14 = local_bf[1] != none;
  local_bf[0] = '.';
  uVar10 = (uint)local_b8._4_4_ >> 0x11;
  local_b8._0_8_ = fspecs;
  if ((uVar10 & 1) != 0) {
    local_bf[0] = decimal_point_impl<char>(loc);
  }
  lVar12 = (ulong)bVar14 + (uVar7 >> 0x20);
  uVar10 = f->exponent;
  local_a8._4_4_ = local_ac + uVar10;
  iVar11 = (int)local_b8._0_8_;
  if (SUB81(local_b8._0_8_,4) == '\x01') {
LAB_00231681:
    iVar3 = uVar10 + local_ac + -1;
    if (((uint)local_b8._4_4_ >> 0x13 & 1) == 0) {
      uVar7 = 0;
      if (local_ac == 1) {
        local_bf[0] = '\0';
      }
    }
    else {
      uVar7 = 0;
      if (0 < iVar11 - local_ac) {
        uVar7 = (ulong)(uint)(iVar11 - local_ac);
      }
      lVar12 = lVar12 + uVar7;
    }
    local_78[0] = local_bf[1];
    local_78._4_4_ = local_a8._0_4_;
    local_70._0_5_ = CONCAT14(local_bf[0],local_ac);
    local_68._0_5_ = CONCAT14('0',(int)uVar7);
    local_68 = (bool *)(CONCAT26(local_68._6_2_,
                                 CONCAT15((((uint)local_b8._4_4_ >> 0x10 & 1) == 0) << 5,
                                          (undefined5)local_68)) | 0x450000000000);
    local_60 = (decimal_fp<float> *)CONCAT44(local_60._4_4_,iVar3);
    if (specs->width < 1) {
      bVar4.container =
           (buffer<char> *)
           do_write_float<fmt::v9::appender,_fmt::v9::detail::dragonbox::decimal_fp<float>,_char,_fmt::v9::detail::digit_grouping<char>_>
           ::anon_class_28_8_ad0ecca5::operator()
                     ((anon_class_28_8_ad0ecca5 *)local_78,
                      out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container);
    }
    else {
      if ((int)local_a8._4_4_ < 1) {
        iVar3 = 1 - local_a8._4_4_;
      }
      lVar8 = 2;
      if (99 < iVar3) {
        lVar8 = (ulong)(999 < iVar3) + 3;
      }
      sVar13 = lVar12 + lVar8 + (3 - (ulong)(local_bf[0] == '\0'));
      bVar4.container =
           (buffer<char> *)
           write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_1_&>
                     (out,specs,sVar13,sVar13,(anon_class_28_8_ad0ecca5 *)local_78);
    }
  }
  else {
    if ((local_b8._0_8_ & 0xff00000000) == 0) {
      iVar3 = 0x10;
      if (0 < iVar11) {
        iVar3 = iVar11;
      }
      if (((int)local_a8._4_4_ < -3) || (iVar3 < (int)local_a8._4_4_)) goto LAB_00231681;
    }
    if ((int)uVar10 < 0) {
      if ((int)local_a8._4_4_ < 1) {
        iVar3 = -local_a8._4_4_;
        local_a0._0_4_ = iVar3;
        if (SBORROW4(iVar11,iVar3) != iVar11 + local_a8._4_4_ < 0) {
          local_a0._0_4_ = iVar11;
        }
        if (iVar11 < 0) {
          local_a0._0_4_ = iVar3;
        }
        if (local_ac != 0) {
          local_a0._0_4_ = iVar3;
        }
        bVar2 = 1;
        if (local_ac == 0 && local_a0._0_4_ == 0) {
          bVar2 = (local_b8[6] & 8) >> 3;
        }
        local_bc = CONCAT31(local_bc._1_3_,bVar2);
        fVar1 = (float_specs)local_b8._0_8_;
        if (-1 < (int)local_a0._0_4_) {
          sVar13 = lVar12 + (ulong)((uint)bVar2 + local_a0._0_4_ + 1);
          local_78 = (undefined1  [8])(local_bf + 1);
          local_70 = (significand_type *)(local_bf + 2);
          local_68 = (bool *)&local_bc;
          local_60 = (decimal_fp<float> *)local_bf;
          local_58 = (digit_grouping<char> *)local_a0;
          local_50 = (digit_grouping<char> *)local_a8;
          local_48 = (uint *)&local_ac;
          aVar5 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_4_&>
                            (out,specs,sVar13,sVar13,(anon_class_56_7_162c6e41 *)local_78);
          return (appender)
                 aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.
                 container;
        }
LAB_002319f0:
        local_b8._0_8_ = fVar1;
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/fmt-src/include/fmt/core.h"
                    ,0x199,"negative value");
      }
      uVar10 = iVar11 - local_ac & (int)(local_b8._4_4_ << 0xc) >> 0x1f;
      local_bc = uVar10;
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)local_a0,loc,
                 (bool)((byte)((uint)local_b8._4_4_ >> 0x11) & 1));
      pbVar6 = (byte *)CONCAT44(local_a0._4_4_,local_a0._0_4_);
      pbVar9 = pbVar6 + local_a0._8_8_;
      iVar11 = 0;
      if ((int)uVar10 < 1) {
        uVar10 = 0;
      }
      sVar13 = (ulong)uVar10 + (uVar7 >> 0x20) + (ulong)bVar14;
      do {
        iVar3 = 0x7fffffff;
        if (local_80 != '\0') {
          if (pbVar6 == pbVar9) {
            uVar10 = (uint)(char)pbVar9[-1];
          }
          else {
            bVar2 = *pbVar6;
            if ((byte)(bVar2 + 0x81) < 0x82) goto LAB_002318c4;
            pbVar6 = pbVar6 + 1;
            uVar10 = (uint)bVar2;
          }
          iVar11 = iVar11 + uVar10;
          iVar3 = iVar11;
        }
LAB_002318c4:
        sVar13 = sVar13 + 1;
      } while (iVar3 < local_ac);
      local_78 = (undefined1  [8])(local_bf + 1);
      local_70 = (significand_type *)local_a8;
      local_68 = (bool *)&local_ac;
      local_60 = (decimal_fp<float> *)(local_a8 + 4);
      local_58 = (digit_grouping<char> *)local_bf;
      local_48 = &local_bc;
      local_40 = (uint *)(local_bf + 2);
      local_50 = (digit_grouping<char> *)local_a0;
      bVar4.container =
           (buffer<char> *)
           write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_3_&>
                     (out,specs,sVar13,sVar13,(anon_class_64_8_e6ffa566 *)local_78);
    }
    else {
      lVar12 = lVar12 + (ulong)uVar10;
      local_bc = iVar11 - local_a8._4_4_;
      if (((uint)local_b8._4_4_ >> 0x13 & 1) != 0) {
        if (SUB81(local_b8._0_8_,4) != '\x02' && (int)local_bc < 1) {
          local_bc = 1;
        }
        lVar12 = lVar12 + 1;
        if (0 < (long)(int)local_bc) {
          lVar12 = lVar12 + (int)local_bc;
        }
      }
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)local_a0,loc,
                 (bool)((byte)((uint)local_b8._4_4_ >> 0x11) & 1));
      pbVar6 = (byte *)CONCAT44(local_a0._4_4_,local_a0._0_4_);
      pbVar9 = pbVar6 + local_a0._8_8_;
      sVar13 = lVar12 - 1;
      iVar11 = 0;
      do {
        iVar3 = 0x7fffffff;
        if (local_80 != '\0') {
          if (pbVar6 == pbVar9) {
            uVar10 = (uint)(char)pbVar9[-1];
          }
          else {
            bVar2 = *pbVar6;
            if ((byte)(bVar2 + 0x81) < 0x82) goto LAB_002317b7;
            pbVar6 = pbVar6 + 1;
            uVar10 = (uint)bVar2;
          }
          iVar11 = iVar11 + uVar10;
          iVar3 = iVar11;
        }
LAB_002317b7:
        sVar13 = sVar13 + 1;
      } while (iVar3 < (int)local_a8._4_4_);
      local_78 = (undefined1  [8])(local_bf + 1);
      local_70 = (significand_type *)local_a8;
      local_68 = (bool *)&local_ac;
      local_50 = (digit_grouping<char> *)local_b8;
      local_48 = (uint *)local_bf;
      local_40 = &local_bc;
      local_38 = local_bf + 2;
      local_60 = f;
      local_58 = (digit_grouping<char> *)local_a0;
      bVar4.container =
           (buffer<char> *)
           write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_2_&>
                     (out,specs,sVar13,sVar13,(anon_class_72_9_0c6a3a8a *)local_78);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_a0._4_4_,local_a0._0_4_) != &local_90) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_a0._4_4_,local_a0._0_4_),local_90._M_allocated_capacity + 1)
      ;
    }
  }
  return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)bVar4.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}